

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_button_image_text(nk_context *ctx,nk_image img,char *text,int len,nk_flags align)

{
  nk_rect bounds_00;
  nk_image img_00;
  nk_widget_layout_states len_00;
  nk_flags *state_00;
  undefined8 unaff_RBX;
  long in_RDI;
  nk_style_button *unaff_R14;
  nk_user_font *unaff_retaddr;
  nk_input *in_stack_00000008;
  nk_widget_layout_states state;
  nk_rect bounds;
  nk_style *style;
  nk_input *in;
  nk_panel *layout;
  nk_window *win;
  nk_context *in_stack_ffffffffffffff40;
  nk_rect *in_stack_ffffffffffffff48;
  undefined8 local_a8;
  nk_flags in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  nk_command_buffer *in_stack_ffffffffffffffa8;
  long lVar1;
  float fVar2;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  int iVar3;
  
  if (((in_RDI == 0) || (*(long *)(in_RDI + 0x3fc8) == 0)) ||
     (*(long *)(*(long *)(in_RDI + 0x3fc8) + 0xa0) == 0)) {
    iVar3 = 0;
  }
  else {
    fVar2 = (float)*(long *)(in_RDI + 0x3fc8);
    state_00 = (nk_flags *)(in_RDI + 0x150);
    lVar1 = *(long *)(*(long *)(in_RDI + 0x3fc8) + 0xa0);
    len_00 = nk_widget(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    if (len_00 == NK_WIDGET_INVALID) {
      iVar3 = 0;
    }
    else {
      if ((len_00 == NK_WIDGET_ROM) || (local_a8 = in_RDI, (*(uint *)(lVar1 + 4) & 0x800) != 0)) {
        local_a8 = 0;
      }
      bounds_00.y = (float)(int)lVar1;
      bounds_00.w = (float)(int)((ulong)lVar1 >> 0x20);
      bounds_00.x = (float)(int)((ulong)local_a8 >> 0x20);
      bounds_00.h = fVar2;
      img_00.w = (short)in_stack_ffffffffffffffe8;
      img_00.h = (short)((uint)in_stack_ffffffffffffffe8 >> 0x10);
      img_00.handle.ptr = (void *)in_RDI;
      img_00.region[0] = (short)in_stack_ffffffffffffffec;
      img_00.region[1] = (short)((uint)in_stack_ffffffffffffffec >> 0x10);
      img_00.region[2] = (short)unaff_RBX;
      img_00.region[3] = (short)((ulong)unaff_RBX >> 0x10);
      img_00._20_4_ = (int)((ulong)unaff_RBX >> 0x20);
      iVar3 = nk_do_button_text_image
                        (state_00,in_stack_ffffffffffffffa8,bounds_00,img_00,
                         in_stack_ffffffffffffffa0,len_00,in_stack_ffffffffffffff98,
                         (nk_button_behavior)((ulong)in_stack_ffffffffffffffa8 >> 0x20),unaff_R14,
                         unaff_retaddr,in_stack_00000008);
    }
  }
  return iVar3;
}

Assistant:

NK_API int
nk_button_image_text(struct nk_context *ctx, struct nk_image img,
    const char *text, int len, nk_flags align)
{
    struct nk_window *win;
    struct nk_panel *layout;
    const struct nk_input *in;
    const struct nk_style *style;

    struct nk_rect bounds;
    enum nk_widget_layout_states state;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return 0;

    win = ctx->current;
    style = &ctx->style;
    layout = win->layout;

    state = nk_widget(&bounds, ctx);
    if (!state) return 0;
    in = (state == NK_WIDGET_ROM || layout->flags & NK_WINDOW_ROM) ? 0 : &ctx->input;
    return nk_do_button_text_image(&ctx->last_widget_state, &win->buffer,
            bounds, img, text, len, align, ctx->button_behavior,
            &style->button, style->font, in);
}